

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int iCol,char *zExpr,Fts5Expr **ppNew,char **pzErr)

{
  fts5yyStackEntry *pfVar1;
  char cVar2;
  short sVar3;
  Fts5Parse *pFVar4;
  undefined8 uVar5;
  Fts5Config *pFVar6;
  Fts5Expr **ppFVar7;
  char **ppcVar8;
  byte bVar9;
  int iVar10;
  fts5yyParser *fts5yypParser_00;
  Fts5ExprPhrase *pFVar11;
  Fts5ExprNode *pFVar12;
  char *pcVar13;
  long lVar14;
  Fts5Colset *pFVar15;
  Fts5Expr *pFVar16;
  Fts5ExprNode *pFVar17;
  byte bVar18;
  uchar *puVar19;
  byte *pbVar20;
  Fts5ExprNode *pFVar21;
  Fts5ExprNode *pFVar22;
  long lVar23;
  uint uVar24;
  fts5YYMINORTYPE *extraout_RDX;
  uchar *fts5yypminor;
  fts5YYMINORTYPE *extraout_RDX_00;
  fts5YYMINORTYPE *extraout_RDX_01;
  fts5YYMINORTYPE *extraout_RDX_02;
  fts5YYMINORTYPE *fts5yypminor_00;
  fts5YYMINORTYPE *extraout_RDX_03;
  fts5YYMINORTYPE *extraout_RDX_04;
  fts5YYMINORTYPE *extraout_RDX_05;
  ulong uVar25;
  byte bVar26;
  Fts5ExprNearset *pNear;
  Fts5Colset *pFVar27;
  ulong uVar28;
  Fts5Colset *pFVar29;
  fts5yyStackEntry *pfVar30;
  fts5yyParser *fts5yypParser;
  fts5yyStackEntry *pfVar31;
  uint local_b4;
  int local_b0;
  Fts5Parse local_a0;
  int local_74;
  Fts5Config *local_70;
  Fts5Colset *local_68;
  Fts5Expr **local_60;
  char **local_58;
  Fts5ExprNode *local_50;
  fts5yyStackEntry *local_48;
  Fts5Colset *local_40;
  int local_38;
  
  *ppNew = (Fts5Expr *)0x0;
  *pzErr = (char *)0x0;
  local_a0.apPhrase = (Fts5ExprPhrase **)0x0;
  local_a0.pExpr = (Fts5ExprNode *)0x0;
  local_a0.zErr = (char *)0x0;
  local_a0.rc = 0;
  local_a0.nPhrase = 0;
  iVar10 = sqlite3_initialize();
  if (iVar10 != 0) {
    return 7;
  }
  local_74 = iCol;
  local_70 = pConfig;
  local_68 = (Fts5Colset *)zExpr;
  local_60 = ppNew;
  local_58 = pzErr;
  fts5yypParser_00 = (fts5yyParser *)sqlite3Malloc(0x978);
  if (fts5yypParser_00 == (fts5yyParser *)0x0) {
    return 7;
  }
  local_48 = fts5yypParser_00->fts5yystack;
  fts5yypParser_00->fts5yytos = local_48;
  fts5yypParser_00->fts5yystack[0].stateno = '\0';
  fts5yypParser_00->fts5yystack[0].major = '\0';
  fts5yypParser_00->fts5yystackEnd = fts5yypParser_00->fts5yystack + 99;
  local_a0.pConfig = local_70;
  pFVar15 = local_68;
  fts5yypminor = (uchar *)extraout_RDX;
  pFVar29 = local_68;
  pfVar30 = local_48;
  do {
    while( true ) {
      bVar9 = (byte)pFVar29->nCol;
      if (0x1f < bVar9) break;
      fts5yypminor = (uchar *)(ulong)(bVar9 - 9);
      if ((1 < bVar9 - 9) && (bVar9 != 0xd)) {
        if (bVar9 == 0) {
          local_b4 = 0;
          goto LAB_001b75a8;
        }
        goto switchD_001b7493_caseD_21;
      }
switchD_001b7493_caseD_20:
      pFVar15 = (Fts5Colset *)((long)&pFVar15->nCol + 1);
      pFVar29 = (Fts5Colset *)((long)&pFVar29->nCol + 1);
    }
    if (0x39 < bVar9) {
      if (bVar9 < 0x7b) {
        if (bVar9 == 0x3a) {
          local_b4 = 5;
        }
        else {
          if (bVar9 != 0x5e) goto switchD_001b7493_caseD_21;
          local_b4 = 0xc;
        }
      }
      else if (bVar9 == 0x7b) {
        local_b4 = 7;
      }
      else {
        if (bVar9 != 0x7d) goto switchD_001b7493_caseD_21;
        local_b4 = 8;
      }
      goto LAB_001b75a8;
    }
    uVar24 = bVar9 - 0x20;
    if (uVar24 < 0xe) {
      fts5yypminor = (uchar *)((long)&switchD_001b7493::switchdataD_001fed50 +
                              (long)(int)(&switchD_001b7493::switchdataD_001fed50)[uVar24]);
      switch((uint)bVar9) {
      case 0x20:
        goto switchD_001b7493_caseD_20;
      default:
        goto switchD_001b7493_caseD_21;
      case 0x22:
        pFVar27 = pFVar29;
        do {
          cVar2 = *(char *)((long)&pFVar27->nCol + 1);
          if (cVar2 == '\"') {
            if (*(char *)((long)&pFVar27->nCol + 2) != '\"') {
              lVar14 = (long)pFVar27 + (2 - (long)pFVar15);
              local_b0 = (int)lVar14;
              local_b4 = 9;
              goto LAB_001b75b2;
            }
            pFVar27 = (Fts5Colset *)((long)&pFVar27->nCol + 2);
          }
          else {
            pFVar27 = (Fts5Colset *)((long)&pFVar27->nCol + 1);
          }
        } while (cVar2 != '\0');
        sqlite3Fts5ParseError(&local_a0,"unterminated string");
        fts5yypminor = (uchar *)extraout_RDX_00;
        goto LAB_001b755a;
      case 0x28:
        local_b4 = 10;
        break;
      case 0x29:
        local_b4 = 0xb;
        break;
      case 0x2a:
        local_b4 = 0xf;
        break;
      case 0x2b:
        local_b4 = 0xe;
        break;
      case 0x2c:
        local_b4 = 0xd;
        break;
      case 0x2d:
        local_b4 = 6;
      }
LAB_001b75a8:
      lVar14 = 1;
      local_b0 = 1;
LAB_001b75b2:
      local_68 = (Fts5Colset *)((long)pFVar29->aiCol + (long)(int)lVar14 + -4);
    }
    else {
switchD_001b7493_caseD_21:
      if (((char)bVar9 < '\0') || ((&DAT_002034e0)[bVar9] != '\0')) {
        lVar14 = 1;
        while ((lVar23 = (long)*(char *)((long)pFVar29->aiCol + lVar14 + -4), lVar23 < 0 ||
               (fts5yypminor = &DAT_002034e0, (&DAT_002034e0)[lVar23] != '\0'))) {
          lVar14 = lVar14 + 1;
        }
        local_b0 = (int)lVar14;
        if (local_b0 == 2) {
          local_b4 = (uint)((short)pFVar29->nCol != 0x524f) * 8 + 1;
          local_b0 = 2;
        }
        else if (local_b0 == 3) {
          sVar3 = (short)pFVar29->nCol;
          cVar2 = *(char *)((long)&pFVar29->nCol + 2);
          local_b0 = 3;
          fts5yypminor = (uchar *)0x9;
          if (cVar2 == 'T' && sVar3 == 0x4f4e) {
            fts5yypminor = (uchar *)0x3;
          }
          if (cVar2 == 'D' && sVar3 == 0x4e41) {
            fts5yypminor = (uchar *)0x2;
          }
          local_b4 = (uint)fts5yypminor;
        }
        else {
          local_b4 = 9;
        }
        goto LAB_001b75b2;
      }
      sqlite3Fts5ParseError(&local_a0,"fts5: syntax error near \"%.1s\"",pFVar29);
      fts5yypminor = (uchar *)extraout_RDX_04;
LAB_001b755a:
      local_b4 = 0;
      local_b0 = 1;
    }
    fts5yypParser_00->pParse = &local_a0;
    pfVar31 = fts5yypParser_00->fts5yytos;
    bVar9 = pfVar31->stateno;
    do {
      bVar26 = (byte)local_b4;
      if (bVar9 < 0x23) {
        fts5yypminor = (uchar *)(ulong)",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"
                                       [bVar9];
        puVar19 = (uchar *)((ulong)local_b4 + (long)fts5yypminor);
        if (((uint)puVar19 < 0x79) &&
           (fts5yypminor = 
            "\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
           , "\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
             [(long)puVar19] == bVar26)) {
          pbVar20 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
                    + (long)puVar19;
        }
        else {
          pbVar20 = "PPPPPP_PPiPnnPnnPPPPP[PPPedPPZgPPhP" + bVar9;
        }
        bVar9 = *pbVar20;
      }
      if (bVar9 < 0x53) {
        if (bVar9 < 0x50) {
          fts5yypParser_00->fts5yytos = pfVar31 + 1;
          if (fts5yypParser_00->fts5yystackEnd < pfVar31 + 1) {
            fts5yypParser_00->fts5yytos = pfVar31;
            fts5yyStackOverflow(fts5yypParser_00);
            fts5yypminor = (uchar *)extraout_RDX_02;
          }
          else {
            bVar18 = bVar9 + 0x1f;
            if (bVar9 < 0x23) {
              bVar18 = bVar9;
            }
            pfVar31[1].stateno = bVar18;
            pfVar31[1].major = bVar26;
            pfVar31[1].minor.fts5yy11 = pFVar29;
            pfVar31[1].minor.fts5yy0.n = local_b0;
          }
        }
        else if (bVar9 == 0x51) {
          fts5yypParser_00->fts5yytos = pfVar31 + -1;
        }
        else {
          pFVar4 = fts5yypParser_00->pParse;
          local_40 = pFVar29;
          local_38 = local_b0;
          sqlite3Fts5ParseError(pFVar4,"fts5: syntax error near \"%.*s\"");
          fts5yypParser_00->pParse = pFVar4;
          fts5yy_destructor((fts5yyParser *)(ulong)bVar26,(uchar)&local_40,fts5yypminor_00);
          fts5yypminor = (uchar *)extraout_RDX_03;
        }
        break;
      }
      uVar25 = (ulong)(bVar9 - 0x53);
      if (0x1b < bVar9 - 0x53) goto switchD_001b7649_caseD_c;
      pFVar4 = fts5yypParser_00->pParse;
      switch(uVar25) {
      case 0:
        pFVar4->pExpr = (Fts5ExprNode *)(pfVar31->minor).fts5yy0.p;
        break;
      case 1:
        pFVar11 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar4,pfVar31[-1].minor.fts5yy11);
        goto LAB_001b783c;
      default:
        pFVar17 = (Fts5ExprNode *)pfVar31[-1].minor.fts5yy0.p;
        goto LAB_001b78fe;
      case 3:
      case 6:
        pFVar17 = (Fts5ExprNode *)
                  sqlite3Fts5ParseColset
                            (pFVar4,(Fts5Colset *)0x0,(Fts5Token *)(pfVar31->minor).fts5yy11);
        goto LAB_001b77a9;
      case 4:
        pFVar15 = sqlite3Fts5ParseColset
                            (pFVar4,(Fts5Colset *)0x0,(Fts5Token *)(pfVar31->minor).fts5yy11);
        pfVar31[-1].minor.fts5yy11 = pFVar15;
        pFVar11 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar4,pFVar15);
        goto LAB_001b7955;
      case 5:
        pFVar11 = (Fts5ExprPhrase *)
                  sqlite3Fts5ParseColset
                            (pFVar4,pfVar31[-1].minor.fts5yy11,
                             (Fts5Token *)(pfVar31->minor).fts5yy11);
        goto LAB_001b7955;
      case 7:
        pFVar17 = pfVar31[-2].minor.fts5yy24;
        pFVar21 = (pfVar31->minor).fts5yy24;
        iVar10 = 2;
        goto LAB_001b78f6;
      case 8:
        pFVar17 = pfVar31[-2].minor.fts5yy24;
        pFVar21 = (pfVar31->minor).fts5yy24;
        iVar10 = 1;
        goto LAB_001b78f6;
      case 9:
        pFVar17 = pfVar31[-2].minor.fts5yy24;
        pFVar21 = (pfVar31->minor).fts5yy24;
        iVar10 = 3;
LAB_001b78f6:
        pFVar17 = sqlite3Fts5ParseNode(pFVar4,iVar10,pFVar17,pFVar21,(Fts5ExprNearset *)0x0);
LAB_001b78fe:
        pfVar31[-2].minor.fts5yy0.p = (char *)pFVar17;
        break;
      case 10:
        sqlite3Fts5ParseSetColset(pFVar4,pfVar31[-1].minor.fts5yy24,pfVar31[-4].minor.fts5yy11);
        pcVar13 = pfVar31[-1].minor.fts5yy0.p;
        goto LAB_001b7974;
      case 0xc:
      case 0xd:
        break;
      case 0xe:
        pFVar17 = pfVar31[-1].minor.fts5yy24;
        pFVar21 = (pfVar31->minor).fts5yy24;
        if (pFVar4->rc == 0) {
          pFVar12 = pFVar17;
          if (pFVar17->eType == 2) {
            pFVar12 = pFVar17->apChild[(long)pFVar17->nChild + -1];
          }
          if (pFVar21->eType == 0) {
            sqlite3Fts5ParseNodeFree(pFVar21);
            pFVar4->nPhrase = pFVar4->nPhrase + -1;
          }
          else if (pFVar12->eType == 0) {
            pFVar22 = pFVar21;
            if (pFVar12 != pFVar17) {
              pFVar17->apChild[(long)pFVar17->nChild + -1] = pFVar21;
              pFVar22 = pFVar17;
            }
            uVar24 = pFVar21->pNear->nPhrase;
            lVar14 = (long)(int)(~uVar24 + pFVar4->nPhrase);
            local_50 = pFVar12;
            memmove(pFVar4->apPhrase + lVar14,pFVar4->apPhrase + lVar14 + 1,(long)(int)uVar24 << 3);
            pFVar4->nPhrase = pFVar4->nPhrase + -1;
            sqlite3Fts5ParseNodeFree(local_50);
            pFVar17 = pFVar22;
          }
          else {
            pFVar17 = sqlite3Fts5ParseNode(pFVar4,2,pFVar17,pFVar21,(Fts5ExprNearset *)0x0);
          }
        }
        else {
          sqlite3Fts5ParseNodeFree(pFVar17);
          sqlite3Fts5ParseNodeFree(pFVar21);
          pFVar17 = (Fts5ExprNode *)0x0;
        }
        pfVar31[-1].minor.fts5yy0.p = (char *)pFVar17;
        pfVar30 = local_48;
        break;
      case 0xf:
        pFVar17 = sqlite3Fts5ParseNode
                            (pFVar4,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar31->minor).fts5yy46);
        goto LAB_001b77a9;
      case 0x10:
        pFVar17 = sqlite3Fts5ParseNode
                            (pFVar4,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar31->minor).fts5yy46);
        sqlite3Fts5ParseSetColset(pFVar4,pFVar17,pfVar31[-2].minor.fts5yy11);
        pfVar31[-2].minor.fts5yy24 = pFVar17;
        break;
      case 0x11:
      case 0x14:
        pFVar17 = (Fts5ExprNode *)
                  sqlite3Fts5ParseNearset(pFVar4,(Fts5ExprNearset *)0x0,(pfVar31->minor).fts5yy53);
LAB_001b77a9:
        (pfVar31->minor).fts5yy46 = (Fts5ExprNearset *)pFVar17;
        break;
      case 0x12:
        pFVar11 = (pfVar31->minor).fts5yy53;
        if (pFVar11 == (Fts5ExprPhrase *)0x0) {
          pFVar11 = (Fts5ExprPhrase *)0x0;
        }
        else if (pFVar11->nTerm != 0) {
          pFVar11->aTerm[0].bFirst = '\x01';
          pFVar11 = (pfVar31->minor).fts5yy53;
        }
        pNear = (Fts5ExprNearset *)0x0;
        goto LAB_001b7950;
      case 0x13:
        if ((pfVar31[-4].minor.fts5yy0.n != 4) || ((pfVar31[-4].minor.fts5yy11)->nCol != 0x5241454e)
           ) {
          sqlite3Fts5ParseError(pFVar4,"fts5: syntax error near \"%.*s\"");
        }
        if (pfVar31[-2].minor.fts5yy11 != (Fts5Colset *)0x0) {
          uVar24 = pfVar31[-1].minor.fts5yy0.n;
          if ((ulong)uVar24 == 0) {
            iVar10 = 10;
          }
          else if ((int)uVar24 < 1) {
            iVar10 = 0;
          }
          else {
            uVar28 = 0;
            iVar10 = 0;
            do {
              bVar9 = pfVar31[-1].minor.fts5yy0.p[uVar28];
              if (9 < (byte)(bVar9 - 0x30)) {
                sqlite3Fts5ParseError(pFVar4,"expected integer, got \"%.*s\"");
                goto LAB_001b7970;
              }
              iVar10 = (uint)bVar9 + iVar10 * 10 + -0x30;
              uVar28 = uVar28 + 1;
            } while (uVar24 != uVar28);
          }
          (pfVar31[-2].minor.fts5yy11)->nCol = iVar10;
        }
LAB_001b7970:
        pcVar13 = pfVar31[-2].minor.fts5yy0.p;
LAB_001b7974:
        pfVar31[-4].minor.fts5yy0.p = pcVar13;
        break;
      case 0x15:
        pNear = pfVar31[-1].minor.fts5yy46;
        pFVar11 = (pfVar31->minor).fts5yy53;
LAB_001b7950:
        pFVar11 = (Fts5ExprPhrase *)sqlite3Fts5ParseNearset(pFVar4,pNear,pFVar11);
        goto LAB_001b7955;
      case 0x16:
      case 0x1b:
        if (pfVar31 < fts5yypParser_00->fts5yystackEnd) {
          iVar10 = (*(code *)(&DAT_001fedf8 + *(int *)(&DAT_001fedf8 + (ulong)(bVar9 - 0x69) * 4)))
                             ();
          return iVar10;
        }
        fts5yyStackOverflow(fts5yypParser_00);
        pfVar31 = fts5yypParser_00->fts5yytos;
        bVar9 = 0;
        fts5yypminor = (uchar *)extraout_RDX_01;
        goto LAB_001b79c0;
      case 0x17:
        uVar5 = *(undefined8 *)((long)&pfVar31->minor + 8);
        pfVar31[-1].minor.fts5yy0.p = (pfVar31->minor).fts5yy0.p;
        *(undefined8 *)((long)&pfVar31[-1].minor + 8) = uVar5;
        break;
      case 0x18:
        pFVar11 = sqlite3Fts5ParseTerm
                            (pFVar4,pfVar31[-3].minor.fts5yy53,
                             (Fts5Token *)pfVar31[-1].minor.fts5yy11,pfVar31[-1].minor.fts5yy0.n);
LAB_001b783c:
        pfVar31[-3].minor.fts5yy53 = pFVar11;
        break;
      case 0x19:
        pFVar11 = sqlite3Fts5ParseTerm
                            (pFVar4,(Fts5ExprPhrase *)0x0,(Fts5Token *)pfVar31[-1].minor.fts5yy11,
                             pfVar31[-1].minor.fts5yy0.n);
LAB_001b7955:
        pfVar31[-1].minor.fts5yy53 = pFVar11;
        break;
      case 0x1a:
        (pfVar31->minor).fts5yyinit = 1;
      }
switchD_001b7649_caseD_c:
      bVar26 = "\x10\x14\x14\x14\x14\x15\x15\x11\x11\x11\x11\x11\x11\x13\x13\x12\x12\x16\x16\x16\x17\x17\x19\x19\x18\x18\x1a\x1a"
               [uVar25];
      pfVar1 = pfVar31 + fts5yyRuleInfoNRhs[uVar25];
      pfVar31 = pfVar1 + 1;
      fts5yypminor = 
      "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
      ;
      bVar9 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
              [(long)fts5yy_reduce_ofst[pfVar1->stateno] + (ulong)bVar26];
      fts5yypParser_00->fts5yytos = pfVar31;
      pfVar31->stateno = bVar9;
      pfVar1[1].major = bVar26;
LAB_001b79c0:
    } while (pfVar30 < pfVar31);
  } while ((local_b4 != 0) && (pFVar15 = local_68, pFVar29 = local_68, local_a0.rc == 0));
  while (pfVar31 = fts5yypParser_00->fts5yytos, pfVar30 < pfVar31) {
    fts5yypParser_00->fts5yytos = pfVar31 + -1;
    fts5yy_destructor((fts5yyParser *)(ulong)pfVar31->major,(char)pfVar31 + '\b',
                      (fts5YYMINORTYPE *)fts5yypminor);
    fts5yypminor = (uchar *)extraout_RDX_05;
  }
  sqlite3_free(fts5yypParser_00);
  ppcVar8 = local_58;
  ppFVar7 = local_60;
  pFVar6 = local_70;
  iVar10 = local_74;
  if (local_a0.rc == 0 && (local_a0.pExpr != (Fts5ExprNode *)0x0 && local_74 < local_70->nCol)) {
    pFVar15 = (Fts5Colset *)sqlite3Fts5MallocZero(&local_a0.rc,8);
    if (pFVar15 != (Fts5Colset *)0x0) {
      pFVar15->nCol = 1;
      pFVar15->aiCol[0] = iVar10;
      sqlite3Fts5ParseSetColset(&local_a0,local_a0.pExpr,pFVar15);
    }
  }
  if (local_a0.rc == 0) {
    iVar10 = sqlite3_initialize();
    if (iVar10 == 0) {
      pFVar16 = (Fts5Expr *)sqlite3Malloc(0x28);
      *ppFVar7 = pFVar16;
      if (pFVar16 != (Fts5Expr *)0x0) {
        if (local_a0.pExpr == (Fts5ExprNode *)0x0) {
          pFVar17 = (Fts5ExprNode *)sqlite3Fts5MallocZero(&local_a0.rc,0x38);
          pFVar16->pRoot = pFVar17;
          if (pFVar17 != (Fts5ExprNode *)0x0) {
            pFVar17->bEof = 1;
          }
        }
        else {
          pFVar16->pRoot = local_a0.pExpr;
        }
        pFVar16->pIndex = (Fts5Index *)0x0;
        pFVar16->pConfig = pFVar6;
        pFVar16->apExprPhrase = local_a0.apPhrase;
        pFVar16->nPhrase = local_a0.nPhrase;
        local_a0.apPhrase = (Fts5ExprPhrase **)0x0;
        goto LAB_001b7cb2;
      }
    }
    else {
      *ppFVar7 = (Fts5Expr *)0x0;
    }
    local_a0.rc = 7;
  }
  sqlite3Fts5ParseNodeFree(local_a0.pExpr);
LAB_001b7cb2:
  sqlite3_free(local_a0.apPhrase);
  *ppcVar8 = local_a0.zErr;
  return local_a0.rc;
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew, 
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( iCol<pConfig->nCol && sParse.pExpr && sParse.rc==SQLITE_OK ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      if( !sParse.pExpr ){
        const int nByte = sizeof(Fts5ExprNode);
        pNew->pRoot = (Fts5ExprNode*)sqlite3Fts5MallocZero(&sParse.rc, nByte);
        if( pNew->pRoot ){
          pNew->pRoot->bEof = 1;
        }
      }else{
        pNew->pRoot = sParse.pExpr;
      }
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  *pzErr = sParse.zErr;
  return sParse.rc;
}